

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_node_impl.h
# Opt level: O2

int __thiscall
node::BinaryNode<label::StringLabel>::get_tree_size(BinaryNode<label::StringLabel> *this)

{
  __uniq_ptr_impl<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
  this_00;
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    this_00._M_t.
    super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
    .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>._M_head_impl =
         (this->left_child_)._M_t.
         super___uniq_ptr_impl<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
         ._M_t;
    iVar1 = 1;
    if ((_Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
         )this_00._M_t.
          super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
          .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>._M_head_impl !=
        (BinaryNode<label::StringLabel> *)0x0) {
      iVar1 = get_tree_size((BinaryNode<label::StringLabel> *)
                            this_00._M_t.
                            super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
                            .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>.
                            _M_head_impl);
      iVar1 = iVar1 + 1;
    }
    iVar2 = iVar2 + iVar1;
    this = (this->right_child_)._M_t.
           super___uniq_ptr_impl<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
           .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>._M_head_impl;
  } while (this != (BinaryNode<label::StringLabel> *)0x0);
  return iVar2;
}

Assistant:

int BinaryNode<Label>::get_tree_size() const {
  int size = 1;

  if(left_child_ != nullptr)
    size += left_child_->get_tree_size();
  if(right_child_ != nullptr)
    size += right_child_->get_tree_size();

  return size;
}